

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

void EDCircles::A_TperB(double **_A,double **_B,double **_res,int _righA,int _colA,int _righB,
                       int _colB)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  if (0 < _colA) {
    uVar2 = 1;
    do {
      if (0 < _colB) {
        pdVar1 = _res[uVar2];
        uVar3 = 1;
        do {
          pdVar1[uVar3] = 0.0;
          if (0 < _righA) {
            dVar5 = 0.0;
            uVar4 = 1;
            do {
              dVar5 = dVar5 + _A[uVar4][uVar2] * _B[uVar4][uVar3];
              pdVar1[uVar3] = dVar5;
              uVar4 = uVar4 + 1;
            } while (_righA + 1 != uVar4);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != _colB + 1);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != _colA + 1);
  }
  return;
}

Assistant:

void EDCircles::A_TperB(double ** _A, double ** _B, double ** _res, int _righA, int _colA, int _righB, int _colB)
{
	int p, q, l;
	for (p = 1; p <= _colA; p++)
		for (q = 1; q <= _colB; q++)
		{
			_res[p][q] = 0.0;
			for (l = 1; l <= _righA; l++)
				_res[p][q] = _res[p][q] + _A[l][p] * _B[l][q];
		}
}